

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::ClaimName
          (CWriter *this,SymbolSet *set,SymbolMap *map,char type_suffix,string_view wasm_name,
          string *c_name)

{
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar2;
  allocator<char> local_79;
  undefined1 local_78 [6];
  bool success;
  undefined1 local_58 [8];
  string type_tagged_wasm_name;
  char type_suffix_local;
  SymbolMap *map_local;
  SymbolSet *set_local;
  CWriter *this_local;
  string_view wasm_name_local;
  
  wasm_name_local._M_len = (size_t)wasm_name._M_str;
  this_local = (CWriter *)wasm_name._M_len;
  type_tagged_wasm_name.field_2._M_local_buf[0xf] = type_suffix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_78,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_79);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 type_tagged_wasm_name.field_2._M_local_buf[0xf]);
  std::__cxx11::string::~string((string *)local_78);
  std::allocator<char>::~allocator(&local_79);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(set,c_name);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __assert_fail("success",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0x36c,
                  "void wabt::(anonymous namespace)::CWriter::ClaimName(SymbolSet &, SymbolMap &, char, std::string_view, const std::string &)"
                 );
  }
  pVar2 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)map,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,c_name);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__cxx11::string::~string((string *)local_58);
    return;
  }
  __assert_fail("success",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x36f,
                "void wabt::(anonymous namespace)::CWriter::ClaimName(SymbolSet &, SymbolMap &, char, std::string_view, const std::string &)"
               );
}

Assistant:

void CWriter::ClaimName(SymbolSet& set,
                        SymbolMap& map,
                        char type_suffix,
                        std::string_view wasm_name,
                        const std::string& c_name) {
  const std::string type_tagged_wasm_name =
      std::string(wasm_name) + type_suffix;

  [[maybe_unused]] bool success;
  success = set.insert(c_name).second;
  assert(success);

  success = map.emplace(type_tagged_wasm_name, c_name).second;
  assert(success);
}